

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O2

void __thiscall dgrminer::PartialUnion::performSimpleTimeAbstraction(PartialUnion *this)

{
  pointer paVar1;
  pointer paVar2;
  pointer paVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  
  paVar1 = (this->nodes).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar2 = (this->nodes).
           super__Vector_base<std::array<int,_6UL>,_std::allocator<std::array<int,_6UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar4 = paVar1->_M_elems + 5;
  for (uVar6 = 0; uVar6 < (ulong)(((long)paVar2 - (long)paVar1) / 0x18); uVar6 = uVar6 + 1) {
    iVar7 = -1;
    if ((piVar4[-1] < 0) || (iVar7 = 1, piVar4[-1] != 0)) {
      piVar4[-1] = iVar7;
    }
    *piVar4 = -(uint)(*piVar4 != ((array<int,_6UL> *)(piVar4 + -5))->_M_elems[0]);
    piVar4 = piVar4 + 6;
  }
  paVar3 = (this->edges).
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->edges).
                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 5;
  piVar4 = paVar3->_M_elems + 6;
  while (bVar8 = lVar5 != 0, lVar5 = lVar5 + -1, bVar8) {
    iVar7 = -1;
    if ((*piVar4 < 0) || (iVar7 = 1, *piVar4 != 0)) {
      *piVar4 = iVar7;
    }
    piVar4 = piVar4 + 8;
  }
  return;
}

Assistant:

void PartialUnion::performSimpleTimeAbstraction()
	{
		for (size_t i = 0; i < nodes.size(); i++)
		{
			if (nodes[i][PN_CHANGETIME] < 0)
			{
				nodes[i][PN_CHANGETIME] = -1;
			}
			else if (nodes[i][PN_CHANGETIME] > 0)
			{
				nodes[i][PN_CHANGETIME] = 1;
			}
			nodes[i][PN_CHANGETIMELINK] = (nodes[i][PN_CHANGETIMELINK] == nodes[i][PN_TIME]) ? 0 : -1;
		}

		for (size_t i = 0; i < edges.size(); i++)
		{
			if (edges[i][PE_CHANGETIME] < 0)
			{
				edges[i][PE_CHANGETIME] = -1;
			}
			else if (edges[i][PE_CHANGETIME] > 0)
			{
				edges[i][PE_CHANGETIME] = 1;
			}
		}

	}